

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O3

bool check_parting_blow(CHAR_DATA *ch,CHAR_DATA *victim)

{
  int iVar1;
  int iVar2;
  
  if (ch->in_room != victim->in_room) {
    return false;
  }
  iVar1 = get_skill(victim,(int)gsn_parting_blow);
  if (0 < iVar1) {
    iVar1 = number_percent();
    iVar2 = get_skill(victim,(int)gsn_parting_blow);
    if (iVar1 < iVar2) {
      act("You get in one more shot as $N flees.",victim,(void *)0x0,ch,3);
      act("$n gets in one more shot as $N flees.",victim,(void *)0x0,ch,1);
      act("$n gets in one more shot as you flee.",victim,(void *)0x0,ch,2);
      check_improve(victim,(int)gsn_parting_blow,true,1);
      iVar1 = one_hit_new(victim,ch,(int)gsn_parting_blow,false,false,0,100,(char *)0x0);
      if (iVar1 == -1) {
        return true;
      }
    }
    else {
      check_improve(victim,(int)gsn_parting_blow,false,3);
    }
  }
  return false;
}

Assistant:

bool check_parting_blow(CHAR_DATA *ch, CHAR_DATA *victim)
{
	if (ch->in_room != victim->in_room)
		return false;

	if (get_skill(victim, gsn_parting_blow) <= 0)
		return false;

	if (number_percent() < get_skill(victim, gsn_parting_blow))
	{
		act("You get in one more shot as $N flees.", victim, 0, ch, TO_CHAR);
		act("$n gets in one more shot as $N flees.", victim, 0, ch, TO_NOTVICT);
		act("$n gets in one more shot as you flee.", victim, 0, ch, TO_VICT);

		check_improve(victim, gsn_parting_blow, true, 1);

		if (one_hit_new(victim, ch, gsn_parting_blow, HIT_NOSPECIALS, HIT_UNBLOCKABLE, HIT_NOADD, 100, nullptr) == -1) // death
			return true;
	}
	else
	{
		check_improve(victim, gsn_parting_blow, false, 3);
	}

	return false;
}